

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O2

void __thiscall
MethodProperty_SetFromValue_Test::MethodProperty_SetFromValue_Test
          (MethodProperty_SetFromValue_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014fde8;
  return;
}

Assistant:

TEST(MethodProperty, SetFromValue)
{
  BasicMethodProperties obj;

  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( 0, obj.int_value2() );
  EXPECT_EQ( 0, obj.int_value3() );
  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( "", obj.string_value2() );
  EXPECT_EQ( "", obj.string_value3() );
  
  obj.int_value = 86;
  obj.string_value = std::string{ "bob" };
  EXPECT_EQ( 86, obj.int_value() );
  EXPECT_EQ( "bob", obj.string_value() );
  
  obj.int_value2 = 34;
  obj.string_value2 = std::string{ "bill" };
  EXPECT_EQ( 34, obj.int_value2() );
  EXPECT_EQ( "bill", obj.string_value2() );
  
  obj.int_value3 = 98;
  obj.string_value3 = std::string{ "john" };
  EXPECT_EQ( 98, obj.int_value3() );
  EXPECT_EQ( "john", obj.string_value3() );
  
  obj.int_value = (int8_t)24;
  obj.string_value = "paul";
  EXPECT_EQ( 24, obj.int_value() );
  EXPECT_EQ( "paul", obj.string_value() );
  
  obj.int_value = (int8_t)64;
  obj.string_value = "rob";
  EXPECT_EQ( 64, obj.int_value() );
  EXPECT_EQ( "rob", obj.string_value() );
  
  obj.int_value = (int8_t)56;
  obj.string_value = "greg";
  EXPECT_EQ( 56, obj.int_value() );
  EXPECT_EQ( "greg", obj.string_value() );
  
  obj.string_holder = "bob";
  EXPECT_EQ( "bob", obj.string_holder().string );
  
  obj.string_holder2 = "bill";
  EXPECT_EQ( "bill", obj.string_holder2().string );
  
  obj.string_holder3 = "john";
  EXPECT_EQ( "john", obj.string_holder3().string );
}